

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O2

bool CLParser::IsSystemInclude(string *path)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  size_type sVar5;
  char cVar6;
  bool bVar7;
  
  pcVar2 = (path->_M_dataplus)._M_p;
  sVar3 = path->_M_string_length;
  for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
    cVar1 = pcVar2[sVar5];
    cVar6 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar6 = cVar1;
    }
    pcVar2[sVar5] = cVar6;
  }
  lVar4 = std::__cxx11::string::find((char *)path,0x11fb3e);
  bVar7 = true;
  if (lVar4 == -1) {
    lVar4 = std::__cxx11::string::find((char *)path,0x11fb4c);
    bVar7 = lVar4 != -1;
  }
  return bVar7;
}

Assistant:

bool CLParser::IsSystemInclude(string path) {
  transform(path.begin(), path.end(), path.begin(), ToLowerASCII);
  // TODO: this is a heuristic, perhaps there's a better way?
  return (path.find("program files") != string::npos ||
          path.find("microsoft visual studio") != string::npos);
}